

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strftime_format.cpp
# Opt level: O2

int32_t __thiscall
duckdb::StrpTimeFormat::TryParseCollection
          (StrpTimeFormat *this,char *data,idx_t *pos,idx_t size,string_t *collection,
          idx_t collection_count)

{
  idx_t iVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  idx_t iVar6;
  char *pcVar7;
  ulong uVar8;
  
  iVar1 = *pos;
  iVar6 = 0;
  do {
    if (iVar6 == collection_count) {
      return -1;
    }
    uVar5 = (ulong)collection[iVar6].value.pointer.length;
    if (uVar5 < 0xd) {
      pcVar7 = collection[iVar6].value.pointer.prefix;
    }
    else {
      pcVar7 = collection[iVar6].value.pointer.ptr;
    }
    uVar4 = iVar1 + uVar5;
    if (uVar4 <= size) {
      uVar8 = 0;
      while( true ) {
        if (uVar5 == uVar8) goto LAB_0155a3c4;
        iVar2 = tolower((int)pcVar7[uVar8]);
        iVar3 = tolower((int)data[uVar8 + iVar1]);
        if (iVar2 != iVar3) break;
        uVar8 = uVar8 + 1;
      }
      if (uVar5 == uVar8) {
LAB_0155a3c4:
        *pos = uVar4;
        return (int32_t)iVar6;
      }
    }
    iVar6 = iVar6 + 1;
  } while( true );
}

Assistant:

int32_t StrpTimeFormat::TryParseCollection(const char *data, idx_t &pos, idx_t size, const string_t collection[],
                                           idx_t collection_count) const {
	for (idx_t c = 0; c < collection_count; c++) {
		auto &entry = collection[c];
		auto entry_data = entry.GetData();
		auto entry_size = entry.GetSize();
		// check if this entry matches
		if (pos + entry_size > size) {
			// too big: can't match
			continue;
		}
		// compare the characters
		idx_t i;
		for (i = 0; i < entry_size; i++) {
			if (std::tolower(entry_data[i]) != std::tolower(data[pos + i])) {
				break;
			}
		}
		if (i == entry_size) {
			// full match
			pos += entry_size;
			return UnsafeNumericCast<int32_t>(c);
		}
	}
	return -1;
}